

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O1

void __thiscall
chrono::ChGlyphs::SetGlyphPoint(ChGlyphs *this,uint id,ChVector<double> *mpoint,ChColor *mcolor)

{
  ulong uVar1;
  ChVector<double> *pCVar2;
  ulong uVar3;
  ChColor *pCVar4;
  
  uVar1 = ((long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar3 = (ulong)id;
  if (uVar1 < uVar3 || uVar1 - uVar3 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
  }
  pCVar2 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar3;
  if (pCVar2 != mpoint) {
    pCVar2->m_data[0] = mpoint->m_data[0];
    pCVar2->m_data[1] = mpoint->m_data[1];
    pCVar2->m_data[2] = mpoint->m_data[2];
  }
  uVar1 = ((long)(this->colors).
                 super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->colors).
                 super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar1 < uVar3 || uVar1 - uVar3 == 0) {
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::resize
              (&this->colors,(ulong)(id + 1));
  }
  pCVar4 = (this->colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
           _M_impl.super__Vector_impl_data._M_start + uVar3;
  if (pCVar4 != mcolor) {
    pCVar4->R = mcolor->R;
    pCVar4->G = mcolor->G;
    pCVar4->B = mcolor->B;
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphPoint(unsigned int id, ChVector<> mpoint, ChColor mcolor) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mpoint;

    if (colors.size() <= id)
        colors.resize(id + 1);
    colors[id] = mcolor;
}